

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PoissonRegressionLoss::forward_impl
          (PoissonRegressionLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  float __x;
  undefined4 uVar1;
  undefined1 auVar2 [16];
  const_reference ppTVar3;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long in_RDI;
  __type_conflict1 _Var4;
  undefined1 auVar5 [64];
  float x;
  __type_conflict1 z;
  uint y;
  undefined1 extraout_var [60];
  
  uVar1 = **(undefined4 **)(in_RDI + 0x58);
  _Var4 = std::lgamma<unsigned_int>(0);
  ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  __x = *(*ppTVar3)->v;
  auVar5._0_4_ = expf(__x);
  auVar5._4_60_ = extraout_var;
  auVar2 = vcvtusi2ss_avx512f(auVar5._0_16_,uVar1);
  **(float **)(in_RDX + 0x28) =
       (float)(((double)auVar5._0_4_ + _Var4) - (double)(auVar2._0_4_ * __x));
  return;
}

Assistant:

void PoissonRegressionLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PoissonRegressionLoss not yet implemented for CUDA");
#else
  const auto y = *pty;
  const auto z = lgamma(y + 1);
  const auto x = xs[0]->v[0];
  fx.v[0] = expf(x) + z - y * x;
#endif
}